

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibTable.cpp
# Opt level: O2

void lib::table::RegisterLibTable(State *state)

{
  Library lib;
  TableMemberReg table [5];
  
  luna::Library::Library(&lib,state);
  table[0].name_ = "concat";
  table[0].field_1.func_ = Concat;
  table[0].type_ = ValueT_CFunction;
  table[1].name_ = "insert";
  table[1].field_1.func_ = Insert;
  table[2].name_ = "pack";
  table[2].field_1.func_ = Pack;
  table[3].name_ = "remove";
  table[3].field_1.func_ = Remove;
  table[4].name_ = "unpack";
  table[4].field_1.func_ = Unpack;
  table[1].type_ = table[0].type_;
  table[2].type_ = table[0].type_;
  table[3].type_ = table[0].type_;
  table[4].type_ = table[0].type_;
  luna::Library::RegisterTableFunction<5ul>(&lib,"table",&table);
  return;
}

Assistant:

void RegisterLibTable(luna::State *state)
    {
        luna::Library lib(state);
        luna::TableMemberReg table[] = {
            { "concat", Concat },
            { "insert", Insert },
            { "pack", Pack },
            { "remove", Remove },
            { "unpack", Unpack }
        };

        lib.RegisterTableFunction("table", table);
    }